

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O0

void __thiscall ProcessesView::mousePressEvent(ProcessesView *this,QMouseEvent *event)

{
  int iVar1;
  MouseButton MVar2;
  long *plVar3;
  long *plVar4;
  offset_in_QAction_to_subr oVar5;
  QString *pQVar6;
  undefined8 local_3e0;
  code *local_3d8;
  undefined8 local_3d0;
  QString local_3c8;
  undefined8 local_3b0;
  Object local_3a8 [8];
  QString local_3a0;
  QString local_388;
  QString local_370;
  QString local_358;
  offset_in_QAction_to_subr local_340;
  QAction *act;
  QPair<const_char_*,_const_char_*> *sig;
  QPair<const_char_*,_const_char_*> *__end2;
  QPair<const_char_*,_const_char_*> *__begin2;
  QPair<const_char_*,_const_char_*> (*__range2) [8];
  QString *local_300;
  QMenu *signalMenu;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 local_278 [8];
  QPair<const_char_*,_const_char_*> signalsList [8];
  QString local_1e8;
  Object local_1d0 [8];
  QString local_1c8;
  QString local_1b0;
  QString local_198;
  QString local_180;
  offset_in_QAction_to_subr local_168;
  QAction *kill;
  QMenu local_148 [8];
  QMenu contextMenu;
  QModelIndex local_120;
  undefined1 local_108 [24];
  QVariant local_f0;
  undefined1 local_d0 [8];
  QString pid;
  QModelIndex local_a8;
  undefined1 local_90 [24];
  QVariant local_78;
  undefined1 local_58 [8];
  QString name;
  QModelIndex local_38;
  int local_1c;
  QMouseEvent *pQStack_18;
  int row;
  QMouseEvent *event_local;
  ProcessesView *this_local;
  
  pQStack_18 = event;
  event_local = (QMouseEvent *)this;
  QTreeView::mousePressEvent((QMouseEvent *)this);
  name.d.size = (qsizetype)QMouseEvent::pos(pQStack_18);
  (**(code **)(*(long *)this + 0x1f0))(&local_38,this,&name.d.size);
  local_1c = QModelIndex::row(&local_38);
  MVar2 = QSinglePointEvent::button((QSinglePointEvent *)pQStack_18);
  if ((MVar2 == RightButton) && (local_1c != -1)) {
    plVar3 = (long *)QAbstractItemView::model();
    plVar4 = (long *)QAbstractItemView::model();
    iVar1 = local_1c;
    QModelIndex::QModelIndex(&local_a8);
    (**(code **)(*plVar4 + 0x60))(local_90,plVar4,iVar1,0,&local_a8);
    (**(code **)(*plVar3 + 0x90))(&local_78,plVar3,local_90,0);
    QVariant::toString();
    QVariant::~QVariant(&local_78);
    plVar3 = (long *)QAbstractItemView::model();
    plVar4 = (long *)QAbstractItemView::model();
    iVar1 = local_1c;
    QModelIndex::QModelIndex(&local_120);
    (**(code **)(*plVar4 + 0x60))(local_108,plVar4,iVar1,3,&local_120);
    (**(code **)(*plVar3 + 0x90))(&local_f0,plVar3,local_108,0);
    QVariant::toString();
    QVariant::~QVariant(&local_f0);
    tr((QString *)&kill,"Context menu",(char *)0x0,-1);
    QMenu::QMenu(local_148,(QString *)&kill,(QWidget *)this);
    QString::~QString((QString *)&kill);
    operator+(&local_1c8,"Terminate ",(QString *)local_58);
    operator+(&local_1b0,&local_1c8," (pid ");
    operator+(&local_198,&local_1b0,(QString *)local_d0);
    operator+(&local_180,&local_198,")");
    oVar5 = QMenu::addAction((QString *)local_148);
    QString::~QString(&local_180);
    QString::~QString(&local_198);
    QString::~QString(&local_1b0);
    QString::~QString(&local_1c8);
    local_168 = oVar5;
    QString::QString(&local_1e8,(QString *)local_d0);
    signalsList[7].second = (char *)QAction::triggered;
    QObject::connect<void(QAction::*)(bool),ProcessesView::mousePressEvent(QMouseEvent*)::__0>
              (local_1d0,oVar5,(anon_class_24_1_ba1d6ceb_for_function *)QAction::triggered);
    QMetaObject::Connection::~Connection((Connection *)local_1d0);
    mousePressEvent(QMouseEvent*)::$_0::~__0((__0 *)&local_1e8);
    QMenu::addSeparator();
    local_280 = "Suspend";
    local_288 = "STOP";
    std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
              ((pair<const_char_*,_const_char_*> *)local_278,&local_280,&local_288);
    local_290 = "Continue";
    local_298 = "CONT";
    std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
              ((pair<const_char_*,_const_char_*> *)&signalsList[0].second,&local_290,&local_298);
    local_2a0 = "Hangup";
    local_2a8 = "HUP";
    std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
              ((pair<const_char_*,_const_char_*> *)&signalsList[1].second,&local_2a0,&local_2a8);
    local_2b0 = "Interrupt";
    local_2b8 = "INT";
    std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
              ((pair<const_char_*,_const_char_*> *)&signalsList[2].second,&local_2b0,&local_2b8);
    local_2c0 = "Terminate";
    local_2c8 = "TERM";
    std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
              ((pair<const_char_*,_const_char_*> *)&signalsList[3].second,&local_2c0,&local_2c8);
    local_2d0 = "Kill";
    local_2d8 = "KILL";
    std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
              ((pair<const_char_*,_const_char_*> *)&signalsList[4].second,&local_2d0,&local_2d8);
    local_2e0 = "User 1";
    local_2e8 = "USR1";
    std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
              ((pair<const_char_*,_const_char_*> *)&signalsList[5].second,&local_2e0,&local_2e8);
    local_2f0 = "User 2";
    signalMenu = (QMenu *)anon_var_dwarf_854d5;
    std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
              ((pair<const_char_*,_const_char_*> *)&signalsList[6].second,&local_2f0,
               (char **)&signalMenu);
    QString::QString((QString *)&__range2,"Send signal");
    pQVar6 = (QString *)QMenu::addMenu((QString *)local_148);
    QString::~QString((QString *)&__range2);
    sig = (QPair<const_char_*,_const_char_*> *)&signalsList[7].second;
    __end2 = (QPair<const_char_*,_const_char_*> *)local_278;
    __begin2 = __end2;
    local_300 = pQVar6;
    for (; pQVar6 = local_300, __end2 != sig; __end2 = __end2 + 1) {
      act = (QAction *)__end2;
      QString::QString(&local_3a0,__end2->first);
      operator+(&local_388,&local_3a0," (");
      operator+(&local_370,&local_388,*(char **)(act + 8));
      operator+(&local_358,&local_370,")");
      oVar5 = QMenu::addAction(pQVar6);
      QString::~QString(&local_358);
      QString::~QString(&local_370);
      QString::~QString(&local_388);
      QString::~QString(&local_3a0);
      local_340 = oVar5;
      QString::QString(&local_3c8,(QString *)local_d0);
      local_3b0 = *(undefined8 *)(act + 8);
      local_3d8 = QAction::triggered;
      local_3d0 = 0;
      QObject::connect<void(QAction::*)(bool),ProcessesView::mousePressEvent(QMouseEvent*)::__1>
                (local_3a8,oVar5,(anon_class_32_2_c8376635_for_function *)QAction::triggered);
      QMetaObject::Connection::~Connection((Connection *)local_3a8);
      mousePressEvent(QMouseEvent*)::$_1::~__1((__1 *)&local_3c8);
    }
    QMouseEvent::pos(pQStack_18);
    local_3e0 = QWidget::mapToGlobal((QPoint *)this);
    QMenu::exec((QPoint *)local_148,(QAction *)&local_3e0);
    QMenu::~QMenu(local_148);
    QString::~QString((QString *)local_d0);
    QString::~QString((QString *)local_58);
  }
  return;
}

Assistant:

void ProcessesView::mousePressEvent(QMouseEvent *event) {
    QTreeView::mousePressEvent(event);
    int row = indexAt(event->pos()).row();

    if (event->button() == Qt::RightButton && row != -1) {
        QString name = model()->data(model()->index(row, NVSMColumns::Name)).toString();
        QString pid = model()->data(model()->index(row, NVSMColumns::PID)).toString();

        QMenu contextMenu(tr("Context menu"), this);

        QAction *kill = contextMenu.addAction("Terminate " + name + " (pid " + pid + ")");
        connect(kill, &QAction::triggered, [pid]() {
            Utils::exec_cmd("kill " + pid);
        });

        contextMenu.addSeparator();

        QPair<const char*, const char*> signalsList[] = {
            {"Suspend", "STOP"},
            {"Continue", "CONT"},
            {"Hangup", "HUP"},
            {"Interrupt", "INT"},
            {"Terminate", "TERM"},
            {"Kill", "KILL"},
            {"User 1", "USR1"},
            {"User 2", "USR2"}
        };

        QMenu *signalMenu = contextMenu.addMenu("Send signal");

        for (auto &sig : signalsList) {
            QAction *act = signalMenu->addAction(QString(sig.first) + " (" + sig.second + ")");
            connect(act, &QAction::triggered, [pid, signal = sig.second]() {
                Utils::exec_cmd("kill -" + QString(signal) + " " + pid);
            });
        }

        contextMenu.exec(mapToGlobal(event->pos()));
    }
}